

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O1

Result<wallet::SelectionResult> *
wallet::SelectCoinsBnB
          (Result<wallet::SelectionResult> *__return_storage_ptr__,
          vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
          CAmount *selection_target,CAmount *cost_of_change,int max_selection_weight)

{
  _Base_ptr p_Var1;
  int iVar2;
  pointer pOVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  unsigned_long uVar7;
  pointer puVar8;
  bool bVar9;
  ulong uVar10;
  optional<long> *poVar11;
  pointer pOVar12;
  size_t *psVar13;
  long lVar14;
  ulong uVar15;
  long extraout_RDX;
  long lVar16;
  pointer puVar17;
  long lVar18;
  undefined4 in_register_00000084;
  ulong uVar19;
  long lVar20;
  pointer pOVar21;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  long lVar22;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  int local_22c;
  long local_220;
  unsigned_long local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b8;
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  local_198 [8];
  _Rb_tree_node_base local_190;
  size_t local_170;
  long local_168;
  undefined8 uStack_160;
  _Storage<long,_true> local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  size_t sStack_140;
  undefined8 local_138;
  CAmount CStack_130;
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined1 uStack_110;
  undefined4 uStack_10f;
  undefined2 uStack_10b;
  undefined1 uStack_109;
  undefined8 *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 uStack_d0;
  undefined4 uStack_cf;
  undefined2 uStack_cb;
  undefined1 uStack_c9;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  SelectionResult local_a8;
  long local_38;
  
  uVar19 = CONCAT44(in_register_00000084,max_selection_weight);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.m_target = *selection_target;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar16 = 0;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.m_algo = BNB;
  local_a8.m_use_effective = false;
  local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  local_a8.m_algo_completed = true;
  local_a8.m_weight = 0;
  local_a8.bump_fee_group_discount = 0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  pOVar21 = (utxo_pool->
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar3 = (utxo_pool->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pOVar21 != pOVar3) {
    lVar16 = 0;
    pOVar12 = pOVar21;
    do {
      lVar14 = *(long *)((long)&pOVar12->m_value +
                        (ulong)((pOVar12->m_subtract_fee_outputs ^ 1) << 5));
      if (lVar14 < 1) {
LAB_00254575:
        __assert_fail("utxo.GetSelectionAmount() > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0x6a,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      lVar16 = lVar16 + lVar14;
      pOVar12 = pOVar12 + 1;
    } while (pOVar12 != pOVar3);
  }
  if (lVar16 < local_a8.m_target) {
    local_c8 = &local_b8;
    uStack_d7 = 0;
    uStack_d0 = 0;
    uStack_cf = 0;
    uStack_cb = 0;
    uStack_c9 = 0;
    uStack_b0 = 0;
    local_e8 = &local_d8;
    *(undefined1 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x11) = 0;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x19) = 0;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1d) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1f) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0';
  }
  else {
    if (pOVar21 != pOVar3) {
      uVar10 = ((long)pOVar3 - (long)pOVar21 >> 3) * 0x4ec4ec4ec4ec4ec5;
      lVar14 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                (pOVar21,pOVar3,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pOVar3 - (long)pOVar21 < 0x681) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (pOVar21,pOVar3);
      }
      else {
        pOVar12 = pOVar21 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__0>>
                  (pOVar21,pOVar12);
        for (; pOVar12 != pOVar3; pOVar12 = pOVar12 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__0>>
                    (pOVar12);
        }
      }
    }
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (ulong *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (ulong *)0x0;
    local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pOVar21 = (utxo_pool->
              super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar14 = (long)(utxo_pool->
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pOVar21;
    if (lVar14 == 0) {
LAB_00254625:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                   (lVar14 >> 3) * 0x4ec4ec4ec4ec4ec5);
LAB_0025465e:
        __assert_fail("best_waste == result.GetWaste()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                      ,0xc6,
                      "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                     );
      }
      goto LAB_00254710;
    }
    lVar14 = pOVar21->fee;
    lVar4 = pOVar21->long_term_fee;
    local_1e0 = 0;
    local_220 = 2100000000000000;
    lVar22 = 0;
    local_22c = 0;
    lVar18 = 0;
    bVar9 = false;
    lVar20 = 0;
    do {
      lVar5 = *selection_target;
      bVar6 = true;
      if (lVar5 <= lVar22 + lVar16) {
        if ((lVar22 <= *cost_of_change + lVar5) && (lVar20 <= local_220 || lVar14 <= lVar4)) {
          bVar6 = true;
          if (max_selection_weight < local_22c) {
            bVar9 = true;
            bVar6 = true;
          }
          else if (lVar22 < lVar5) {
            bVar6 = false;
          }
          else {
            lVar20 = (lVar22 - lVar5) + lVar20;
            if (lVar20 <= local_220) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        (&local_1d8,&local_1b8);
              local_220 = lVar20;
            }
            lVar20 = (lVar20 - lVar22) + *selection_target;
          }
        }
      }
      uVar7 = local_1e0;
      if (bVar6) {
        if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1e0 = local_1e0 - 1;
          uVar10 = local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1];
          if (uVar10 < local_1e0) {
            pOVar21 = (utxo_pool->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar15 = ((long)(utxo_pool->
                            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar21 >> 3) *
                     0x4ec4ec4ec4ec4ec5;
            do {
              if (uVar15 < local_1e0 || uVar15 - local_1e0 == 0) {
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00254710;
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                goto LAB_00254575;
              }
              lVar16 = lVar16 + *(long *)((long)&pOVar21[local_1e0].m_value +
                                         (ulong)((pOVar21[local_1e0].m_subtract_fee_outputs ^ 1) <<
                                                5));
              local_1e0 = local_1e0 - 1;
              uVar10 = local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1];
            } while (uVar10 < local_1e0);
          }
          if (local_1e0 != uVar10) goto LAB_002545b9;
          pOVar21 = (utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar10 = ((long)(utxo_pool->
                          super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar21 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          if (local_1e0 <= uVar10 && uVar10 - local_1e0 != 0) {
            local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1;
            lVar5 = -*(long *)((long)&pOVar21[local_1e0].m_value +
                              (ulong)((pOVar21[local_1e0].m_subtract_fee_outputs ^ 1) << 5));
            lVar20 = (lVar20 - pOVar21[local_1e0].fee) + pOVar21[local_1e0].long_term_fee;
            iVar2 = -pOVar21[local_1e0].m_weight;
            goto LAB_00254150;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar10 = uVar19;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_00254600;
          }
          goto LAB_00254710;
        }
        bVar6 = false;
      }
      else {
        pOVar21 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar15 = ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar21 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        uVar10 = local_1e0;
        if (uVar15 < local_1e0 || uVar15 - local_1e0 == 0) {
LAB_00254600:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00254710;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
          lVar14 = extraout_RDX;
          goto LAB_00254625;
        }
        lVar5 = *(long *)((long)&pOVar21[local_1e0].m_value +
                         (ulong)((pOVar21[local_1e0].m_subtract_fee_outputs ^ 1) << 5));
        lVar16 = lVar16 - lVar5;
        if ((local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish) &&
           (uVar10 = local_1e0 - 1, uVar19 = uVar10,
           uVar10 != local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1])) {
          if (uVar15 < uVar10 || uVar15 - uVar10 == 0) goto LAB_00254600;
          uVar19 = uVar10 * 0x68;
          if ((lVar5 == *(long *)((long)&pOVar21[uVar10].m_value +
                                 (ulong)((pOVar21[uVar10].m_subtract_fee_outputs ^ 1) << 5))) &&
             (bVar6 = true, pOVar21[local_1e0].fee == pOVar21[uVar10].fee)) goto LAB_00254152;
        }
        if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1b8,
                     (iterator)
                     local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_1e0);
        }
        else {
          *local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = local_1e0;
          local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        lVar5 = *(long *)((long)&pOVar21[uVar7].m_value +
                         (ulong)((pOVar21[uVar7].m_subtract_fee_outputs ^ 1) << 5));
        lVar20 = (lVar20 + pOVar21[uVar7].fee) - pOVar21[uVar7].long_term_fee;
        iVar2 = pOVar21[uVar7].m_weight;
LAB_00254150:
        local_22c = local_22c + iVar2;
        lVar22 = lVar22 + lVar5;
        bVar6 = true;
      }
LAB_00254152:
      puVar8 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (!bVar6) break;
      lVar18 = lVar18 + 1;
      local_1e0 = local_1e0 + 1;
    } while (lVar18 != 100000);
    if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar9) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_108 = &local_f8;
        local_128 = &local_118;
        *(undefined1 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x11) = 0;
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x19) = 0;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1d) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x1f) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        *(undefined1 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0'
        ;
        uStack_f0 = 0;
        local_f8 = 0;
        uStack_100 = 0;
        uStack_109 = 0;
        uStack_10b = 0;
        uStack_10f = 0;
        uStack_110 = 0;
        uStack_117 = 0;
        local_118 = 0;
        uStack_120 = 0;
      }
    }
    else {
      puVar17 = local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar19 = *puVar17;
        pOVar21 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar21 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        if (uVar10 < uVar19 || uVar10 - uVar19 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_002545b9:
            __assert_fail("utxo_pool_index == curr_selection.back()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                          ,0x9f,
                          "util::Result<SelectionResult> wallet::SelectCoinsBnB(std::vector<OutputGroup> &, const CAmount &, const CAmount &, int)"
                         );
          }
          goto LAB_00254710;
        }
        pOVar21 = pOVar21 + uVar19;
        SelectionResult::
        InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
                  (&local_a8,&pOVar21->m_outputs);
        local_a8.m_use_effective = (bool)(pOVar21->m_subtract_fee_outputs ^ 1);
        local_a8.m_weight = local_a8.m_weight + pOVar21->m_weight;
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar8);
      SelectionResult::RecalculateWaste(&local_a8,*cost_of_change,*cost_of_change,0);
      poVar11 = inline_assertion_check<true,std::optional<long>const&>
                          (&local_a8.m_waste,
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.cpp"
                           ,0x36e,"GetWaste","m_waste");
      if (local_220 !=
          (poVar11->super__Optional_base<long,_true,_true>)._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value) goto LAB_0025465e;
      if (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
        psVar13 = &local_170;
        local_190._M_color = _S_red;
        local_190._M_parent = (_Base_ptr)0x0;
        local_190._M_left = &local_190;
        local_190._M_right = &local_190;
      }
      else {
        psVar13 = &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_190._M_color =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        local_190._M_parent =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_190._M_left =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_190._M_right =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
        _M_parent = &local_190;
        local_170 = local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
        local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      *psVar13 = 0;
      uStack_160 = CONCAT62(local_a8._58_6_,CONCAT11(local_a8.m_use_effective,local_a8.m_algo));
      uStack_150 = CONCAT71(local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._9_7_,
                            local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_engaged);
      local_148 = CONCAT71(local_a8._81_7_,local_a8.m_algo_completed);
      local_138 = CONCAT44(local_a8._100_4_,local_a8.m_weight);
      CStack_130 = local_a8.bump_fee_group_discount;
      sStack_140 = local_a8.m_selections_evaluated;
      local_158 = local_a8.m_waste.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload;
      local_168 = local_a8.m_target;
      p_Var1 = (_Base_ptr)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8);
      if (local_190._M_parent == (_Base_ptr)0x0) {
        *(undefined4 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             p_Var1;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             p_Var1;
        psVar13 = (size_t *)
                  ((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                          super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> +
                  0x28);
      }
      else {
        psVar13 = &local_170;
        *(_Rb_tree_color *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
             local_190._M_color;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
             local_190._M_parent;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) =
             local_190._M_left;
        *(_Base_ptr *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
             local_190._M_right;
        (local_190._M_parent)->_M_parent = p_Var1;
        *(size_t *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
             local_170;
        local_190._M_parent = (_Base_ptr)0x0;
        local_190._M_left = &local_190;
        local_190._M_right = &local_190;
      }
      *psVar13 = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
           local_138;
      *(CAmount *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
           CStack_130;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
           local_148;
      *(size_t *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
           sStack_140;
      *(_Storage<long,_true> *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
           local_158;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
           uStack_150;
      *(long *)((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30)
           = local_168;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
           uStack_160;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01'
      ;
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree(local_198);
    }
    if (local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_1d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _GLOBAL__N_1::std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00254710:
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> SelectCoinsBnB(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, const CAmount& cost_of_change,
                                             int max_selection_weight)
{
    SelectionResult result(selection_target, SelectionAlgorithm::BNB);
    CAmount curr_value = 0;
    std::vector<size_t> curr_selection; // selected utxo indexes
    int curr_selection_weight = 0; // sum of selected utxo weight

    // Calculate curr_available_value
    CAmount curr_available_value = 0;
    for (const OutputGroup& utxo : utxo_pool) {
        // Assert that this utxo is not negative. It should never be negative,
        // effective value calculation should have removed it
        assert(utxo.GetSelectionAmount() > 0);
        curr_available_value += utxo.GetSelectionAmount();
    }
    if (curr_available_value < selection_target) {
        return util::Error();
    }

    // Sort the utxo_pool
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending);

    CAmount curr_waste = 0;
    std::vector<size_t> best_selection;
    CAmount best_waste = MAX_MONEY;

    bool is_feerate_high = utxo_pool.at(0).fee > utxo_pool.at(0).long_term_fee;
    bool max_tx_weight_exceeded = false;

    // Depth First search loop for choosing the UTXOs
    for (size_t curr_try = 0, utxo_pool_index = 0; curr_try < TOTAL_TRIES; ++curr_try, ++utxo_pool_index) {
        // Conditions for starting a backtrack
        bool backtrack = false;
        if (curr_value + curr_available_value < selection_target || // Cannot possibly reach target with the amount remaining in the curr_available_value.
            curr_value > selection_target + cost_of_change || // Selected value is out of range, go back and try other branch
            (curr_waste > best_waste && is_feerate_high)) { // Don't select things which we know will be more wasteful if the waste is increasing
            backtrack = true;
        } else if (curr_selection_weight > max_selection_weight) { // Selected UTXOs weight exceeds the maximum weight allowed, cannot find more solutions by adding more inputs
            max_tx_weight_exceeded = true; // at least one selection attempt exceeded the max weight
            backtrack = true;
        } else if (curr_value >= selection_target) {       // Selected value is within range
            curr_waste += (curr_value - selection_target); // This is the excess value which is added to the waste for the below comparison
            // Adding another UTXO after this check could bring the waste down if the long term fee is higher than the current fee.
            // However we are not going to explore that because this optimization for the waste is only done when we have hit our target
            // value. Adding any more UTXOs will be just burning the UTXO; it will go entirely to fees. Thus we aren't going to
            // explore any more UTXOs to avoid burning money like that.
            if (curr_waste <= best_waste) {
                best_selection = curr_selection;
                best_waste = curr_waste;
            }
            curr_waste -= (curr_value - selection_target); // Remove the excess value as we will be selecting different coins now
            backtrack = true;
        }

        if (backtrack) { // Backtracking, moving backwards
            if (curr_selection.empty()) { // We have walked back to the first utxo and no branch is untraversed. All solutions searched
                break;
            }

            // Add omitted UTXOs back to lookahead before traversing the omission branch of last included UTXO.
            for (--utxo_pool_index; utxo_pool_index > curr_selection.back(); --utxo_pool_index) {
                curr_available_value += utxo_pool.at(utxo_pool_index).GetSelectionAmount();
            }

            // Output was included on previous iterations, try excluding now.
            assert(utxo_pool_index == curr_selection.back());
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);
            curr_value -= utxo.GetSelectionAmount();
            curr_waste -= utxo.fee - utxo.long_term_fee;
            curr_selection_weight -= utxo.m_weight;
            curr_selection.pop_back();
        } else { // Moving forwards, continuing down this branch
            OutputGroup& utxo = utxo_pool.at(utxo_pool_index);

            // Remove this utxo from the curr_available_value utxo amount
            curr_available_value -= utxo.GetSelectionAmount();

            if (curr_selection.empty() ||
                // The previous index is included and therefore not relevant for exclusion shortcut
                (utxo_pool_index - 1) == curr_selection.back() ||
                // Avoid searching a branch if the previous UTXO has the same value and same waste and was excluded.
                // Since the ratio of fee to long term fee is the same, we only need to check if one of those values match in order to know that the waste is the same.
                utxo.GetSelectionAmount() != utxo_pool.at(utxo_pool_index - 1).GetSelectionAmount() ||
                utxo.fee != utxo_pool.at(utxo_pool_index - 1).fee)
            {
                // Inclusion branch first (Largest First Exploration)
                curr_selection.push_back(utxo_pool_index);
                curr_value += utxo.GetSelectionAmount();
                curr_waste += utxo.fee - utxo.long_term_fee;
                curr_selection_weight += utxo.m_weight;
            }
        }
    }

    // Check for solution
    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    // Set output set
    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool.at(i));
    }
    result.RecalculateWaste(cost_of_change, cost_of_change, CAmount{0});
    assert(best_waste == result.GetWaste());

    return result;
}